

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_visible(REF_CAVITY ref_cavity,REF_INT face,REF_BOOL *visible)

{
  REF_NODE ref_node_00;
  double dStack_b0;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL volume;
  REF_INT nodes [27];
  REF_NODE ref_node;
  REF_BOOL *visible_local;
  REF_INT face_local;
  REF_CAVITY ref_cavity_local;
  
  ref_node_00 = ref_cavity->ref_grid->node;
  *visible = 0;
  volume._0_4_ = ref_cavity->f2n[face * 3];
  volume._4_4_ = ref_cavity->f2n[face * 3 + 1];
  nodes[0] = ref_cavity->f2n[face * 3 + 2];
  nodes[1] = ref_cavity->node;
  ref_cavity_local._4_4_ = ref_node_tet_vol(ref_node_00,(REF_INT *)&volume,&stack0xffffffffffffff50)
  ;
  if (ref_cavity_local._4_4_ == 0) {
    if (ref_node_00->min_volume < dStack_b0) {
      *visible = 1;
      ref_cavity_local._4_4_ = 0;
    }
    else {
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x765,
           "ref_cavity_visible",(ulong)ref_cavity_local._4_4_,"norm");
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_visible(REF_CAVITY ref_cavity, REF_INT face,
                                      REF_BOOL *visible) {
  REF_NODE ref_node = ref_grid_node(ref_cavity_grid(ref_cavity));
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL volume;

  *visible = REF_FALSE;

  nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
  nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
  nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
  nodes[3] = ref_cavity_node(ref_cavity);

  RSS(ref_node_tet_vol(ref_node, nodes, &volume), "norm");

  if (volume <= ref_node_min_volume(ref_node)) return REF_SUCCESS;

  *visible = REF_TRUE;

  return REF_SUCCESS;
}